

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall SCCTest_SingletonLoop_Test::TestBody(SCCTest_SingletonLoop_Test *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_00;
  bool bVar1;
  char *pcVar2;
  Iterator IVar3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_3b0;
  AssertHelper local_2d0;
  Message local_2c8;
  allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_2b9;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_2b8;
  undefined1 local_2b7;
  allocator<unsigned_int> local_2b6;
  less<unsigned_int> local_2b5;
  uint local_2b4;
  iterator local_2b0;
  size_type local_2a8;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_2a0;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_298;
  iterator local_268;
  size_type local_260;
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_258;
  SCCSet local_228;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_6;
  Message local_1e0;
  SCC local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_5;
  Message local_1b8;
  SCC local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_4;
  Message local_190;
  Iterator local_188;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  Message local_160;
  uint local_158;
  T local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  Iterator local_130;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Iterator sccIt;
  SCC scc;
  AssertHelper local_f0;
  Message local_e8;
  SCC local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  Iterator it;
  GraphSCCs sccs;
  undefined1 local_28 [8];
  Graph_conflict1 graph;
  SCCTest_SingletonLoop_Test *this_local;
  
  graph.graph.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Graph::Graph((Graph *)local_28,1);
  Graph::addEdge((Graph *)local_28,0,0);
  GraphSCCs::GraphSCCs((GraphSCCs *)&it,(Graph_conflict1 *)local_28);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::wasm::SCCs<IntIt,_GraphSCCs>::begin((SCCs<IntIt,_GraphSCCs> *)&it);
  local_e0.parent =
       (SCCs<IntIt,_GraphSCCs> *)::wasm::SCCs<IntIt,_GraphSCCs>::end((SCCs<IntIt,_GraphSCCs> *)&it);
  testing::internal::
  CmpHelperNE<wasm::SCCs<IntIt,GraphSCCs>::Iterator,wasm::SCCs<IntIt,GraphSCCs>::Iterator>
            ((internal *)local_d8,"it","sccs.end()",(Iterator *)&gtest_ar.message_,
             (Iterator *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  if (bVar1) {
    sccIt.val.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)
         ::wasm::SCCs<IntIt,_GraphSCCs>::Iterator::operator*((Iterator *)&gtest_ar.message_);
    IVar3 = ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::begin((SCC *)&sccIt.val);
    sccIt.parent = (SCCs<IntIt,_GraphSCCs> *)
                   IVar3.val.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )IVar3.parent;
    local_130 = ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::end((SCC *)&sccIt.val);
    testing::internal::
    CmpHelperNE<wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator,wasm::SCCs<IntIt,GraphSCCs>::SCC::Iterator>
              ((internal *)local_120,"sccIt","scc.end()",(Iterator *)&gtest_ar_1.message_,&local_130
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                 ,0x82,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_138);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    if (bVar1) {
      local_154 = ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator::operator*
                            ((Iterator *)&gtest_ar_1.message_);
      local_158 = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_150,"*sccIt","0u",&local_154,&local_158);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
      if (!bVar1) {
        testing::Message::Message(&local_160);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                   ,0x83,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_160);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_160);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
      ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator::operator++((Iterator *)&gtest_ar_1.message_);
      local_188 = ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::end((SCC *)&sccIt.val);
      testing::internal::EqHelper::
      Compare<wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator,_wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator,_nullptr>
                ((EqHelper *)local_178,"sccIt","scc.end()",(Iterator *)&gtest_ar_1.message_,
                 &local_188);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
      if (!bVar1) {
        testing::Message::Message(&local_190);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                   ,0x86,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_190);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_190);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
      local_1b0.parent =
           (SCCs<IntIt,_GraphSCCs> *)
           ::wasm::SCCs<IntIt,_GraphSCCs>::end((SCCs<IntIt,_GraphSCCs> *)&it);
      testing::internal::
      CmpHelperNE<wasm::SCCs<IntIt,GraphSCCs>::Iterator,wasm::SCCs<IntIt,GraphSCCs>::Iterator>
                ((internal *)local_1a8,"it","sccs.end()",(Iterator *)&gtest_ar.message_,
                 (Iterator *)&local_1b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
      if (!bVar1) {
        testing::Message::Message(&local_1b8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                   ,0x87,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_1b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
      if (bVar1) {
        ::wasm::SCCs<IntIt,_GraphSCCs>::Iterator::operator++((Iterator *)&gtest_ar.message_);
        local_1d8.parent =
             (SCCs<IntIt,_GraphSCCs> *)
             ::wasm::SCCs<IntIt,_GraphSCCs>::end((SCCs<IntIt,_GraphSCCs> *)&it);
        testing::internal::EqHelper::
        Compare<wasm::SCCs<IntIt,_GraphSCCs>::Iterator,_wasm::SCCs<IntIt,_GraphSCCs>::Iterator,_nullptr>
                  ((EqHelper *)local_1d0,"it","sccs.end()",(Iterator *)&gtest_ar.message_,
                   (Iterator *)&local_1d8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
        if (!bVar1) {
          testing::Message::Message(&local_1e0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                     ,0x8a,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_6.message_,&local_1e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_1e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
        getSCCs(&local_228,(Graph_conflict1 *)local_28);
        local_2b7 = 1;
        local_2b4 = 0;
        local_2b0 = &local_2b4;
        local_2a8 = 1;
        local_2a0 = &local_298;
        std::allocator<unsigned_int>::allocator(&local_2b6);
        __l._M_len = local_2a8;
        __l._M_array = local_2b0;
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                  (&local_298,__l,&local_2b5,&local_2b6);
        local_2b7 = 0;
        local_268 = &local_298;
        local_260 = 1;
        std::
        allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
        allocator(&local_2b9);
        __l_00._M_len = local_260;
        __l_00._M_array = local_268;
        std::
        set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
        ::set(&local_258,__l_00,&local_2b8,&local_2b9);
        testing::internal::EqHelper::
        Compare<std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_nullptr>
                  ((EqHelper *)local_1f8,"getSCCs(graph)","SCCSet{{0}}",&local_228,&local_258);
        std::
        set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
        ::~set(&local_258);
        std::
        allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
        ~allocator(&local_2b9);
        local_3b0 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    &local_268;
        do {
          local_3b0 = local_3b0 + -1;
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                    (local_3b0);
        } while (local_3b0 != &local_298);
        std::allocator<unsigned_int>::~allocator(&local_2b6);
        std::
        set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
        ::~set(&local_228);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar1) {
          testing::Message::Message(&local_2c8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
                     ,0x8c,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
          testing::internal::AssertHelper::~AssertHelper(&local_2d0);
          testing::Message::~Message(&local_2c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
      }
    }
  }
  GraphSCCs::~GraphSCCs((GraphSCCs *)&it);
  Graph::~Graph((Graph *)local_28);
  return;
}

Assistant:

TEST(SCCTest, SingletonLoop) {
  // Same as above, but now there is an edge. The results are the same.
  Graph graph(1);
  graph.addEdge(0, 0);
  GraphSCCs sccs(graph);

  auto it = sccs.begin();
  ASSERT_NE(it, sccs.end());

  auto scc = *it;
  auto sccIt = scc.begin();
  ASSERT_NE(sccIt, scc.end());
  EXPECT_EQ(*sccIt, 0u);

  ++sccIt;
  EXPECT_EQ(sccIt, scc.end());
  ASSERT_NE(it, sccs.end());

  ++it;
  EXPECT_EQ(it, sccs.end());

  EXPECT_EQ(getSCCs(graph), SCCSet{{0}});
}